

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Invert(InvertForm4 Invert)

{
  value_type vVar1;
  value_type vVar2;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  byte bVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_fffffffffffffdbc;
  uint8_t in_stack_fffffffffffffdc6;
  uint8_t in_stack_fffffffffffffdc7;
  uint32_t in_stack_fffffffffffffdc8;
  uint32_t in_stack_fffffffffffffdcc;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffdd0;
  Image *in_stack_fffffffffffffdd8;
  uint32_t in_stack_fffffffffffffde4;
  uint32_t in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  uint8_t value;
  value_type vVar7;
  uint32_t in_stack_fffffffffffffe14;
  Image *image_00;
  uint32_t *in_stack_fffffffffffffe20;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  uint32_t *in_stack_fffffffffffffe28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe38;
  size_type sVar8;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffe40;
  undefined1 **local_178;
  uint32_t local_148;
  uint32_t local_144;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  undefined1 local_109;
  undefined8 *local_a8;
  undefined1 *local_a0 [5];
  undefined1 local_78 [40];
  undefined8 *local_50;
  undefined8 local_48;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffdbc);
  local_109 = 1;
  local_a8 = local_a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffdec >> 0x18),in_stack_fffffffffffffde8,
             in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8);
  local_a8 = (undefined8 *)local_78;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffdec >> 0x18),in_stack_fffffffffffffde8,
             in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8);
  local_109 = 0;
  local_50 = local_a0;
  local_48 = 2;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1d8f06);
  __l._M_len._0_4_ = in_stack_fffffffffffffe00;
  __l._M_array = (iterator)in_stack_fffffffffffffdf8;
  __l._M_len._4_4_ = in_stack_fffffffffffffe04;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(in_stack_fffffffffffffdf0,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1d8f3a);
  local_178 = (undefined1 **)&local_50;
  do {
    local_178 = local_178 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1d8f6f);
  } while (local_178 != local_a0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d8f99);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d8fa6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d8fbb);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d8fd0);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  image_00 = (Image *)0x0;
  this = &local_40;
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
  this_00 = &local_128;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_00,(size_type)image_00);
  vVar7 = *pvVar5;
  this_01 = &local_140;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_01,(size_type)image_00);
  vVar1 = *pvVar5;
  sVar8 = 1;
  pvVar6 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar8);
  vVar2 = *pvVar5;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar8);
  (*local_10)(pvVar4,vVar7,vVar1,pvVar6,vVar2,*pvVar5,local_144,local_148);
  sVar8 = 1;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_40,1);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_128,sVar8);
  value = (uint8_t)(*pvVar5 >> 0x18);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,sVar8);
  vVar7 = *pvVar5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  bVar3 = Unit_Test::verifyImage(image_00,in_stack_fffffffffffffe14,local_148,local_144,vVar7,value)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdd0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdd0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_fffffffffffffdd0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd0);
  return (bool)(bVar3 & 1);
}

Assistant:

bool form4_Invert(InvertForm4 Invert)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        Invert( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight );

        return verifyImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight, ~intensity[0] );
    }